

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR xpath_local_name(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  uint uVar1;
  lyxp_set_type lVar2;
  lyxp_set_meta *plVar3;
  lyd_meta *plVar4;
  int iVar5;
  char *pcVar6;
  lysc_type **pplVar7;
  size_t sVar8;
  long lVar9;
  lyxp_set *plVar10;
  uint32_t str_len;
  LY_ERR LVar11;
  undefined4 uVar12;
  lysc_type *__s;
  undefined8 uVar13;
  
  if ((options & 0x1c) != 0) {
    uVar1 = set->used;
    if ((ulong)uVar1 != 0) {
      lVar9 = 0;
      do {
        iVar5 = *(int *)((long)&((set->val).nodes)->pos + lVar9);
        uVar12 = 0;
        if (iVar5 == 2) {
LAB_001b6c2e:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar9) = uVar12;
        }
        else if (iVar5 == -2) {
          uVar12 = 0xffffffff;
          goto LAB_001b6c2e;
        }
        lVar9 = lVar9 + 0x18;
      } while ((ulong)uVar1 * 0x18 != lVar9);
    }
    return LY_SUCCESS;
  }
  if (arg_count == 0) {
    lVar2 = set->type;
    if ((long)(int)lVar2 != 0) {
      if (lVar2 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
        uVar13 = *(undefined8 *)(&DAT_00204698 + (long)(int)lVar2 * 8);
      }
      else {
        uVar13 = 0;
      }
      ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Invalid context type %s in %s.",uVar13,
              "local-name(node-set?)");
      return LY_EVALID;
    }
    if (set->used != 0) {
      iVar5 = set_sort(set);
      plVar10 = set;
      if (iVar5 != 0) {
        __assert_fail("!set_sort(set)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x11c8,
                      "LY_ERR xpath_local_name(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t)"
                     );
      }
      goto LAB_001b6cf5;
    }
    __s = (lysc_type *)0x1da9d3;
    str_len = 0;
    goto LAB_001b6df5;
  }
  plVar10 = *args;
  lVar2 = plVar10->type;
  if ((long)(int)lVar2 != 0) {
    if (lVar2 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
      uVar13 = *(undefined8 *)(&DAT_00204698 + (long)(int)lVar2 * 8);
    }
    else {
      uVar13 = 0;
    }
    ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,
            "Wrong type of argument #%d (%s) for the XPath function %s.",1,uVar13,
            "local-name(node-set?)");
    return LY_EVALID;
  }
  if (plVar10->used == 0) {
    lyxp_set_free_content(set);
    set->type = LYXP_SET_STRING;
    pcVar6 = strdup("");
    (set->val).str = pcVar6;
    return LY_SUCCESS;
  }
  iVar5 = set_sort(plVar10);
  if (iVar5 != 0) {
    __assert_fail("!set_sort(args[0])",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x11bb,
                  "LY_ERR xpath_local_name(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t)"
                 );
  }
  plVar10 = *args;
LAB_001b6cf5:
  plVar3 = (plVar10->val).meta;
  LVar11 = LY_SUCCESS;
  switch(plVar3->type) {
  case LYXP_NODE_NONE:
    LVar11 = LY_EINT;
    ly_log(set->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",0x11cf);
    break;
  case LYXP_NODE_ROOT:
  case LYXP_NODE_ROOT_CONFIG:
  case LYXP_NODE_TEXT:
    lyxp_set_free_content(set);
    set->type = LYXP_SET_STRING;
    pcVar6 = strdup("");
    (set->val).str = pcVar6;
    break;
  case LYXP_NODE_ELEM:
    plVar4 = plVar3->meta->next;
    pplVar7 = (lysc_type **)((long)&(plVar3->meta->value).field_2 + 0x10);
    if (plVar4 != (lyd_meta *)0x0) {
      pplVar7 = &(plVar4->value).realtype;
    }
    __s = *pplVar7;
    goto LAB_001b6de5;
  case LYXP_NODE_META:
    __s = (lysc_type *)plVar3->meta->name;
LAB_001b6de5:
    sVar8 = strlen((char *)__s);
    str_len = (uint32_t)sVar8;
LAB_001b6df5:
    LVar11 = LY_SUCCESS;
    set_fill_string(set,(char *)__s,str_len);
  }
  return LVar11;
}

Assistant:

static LY_ERR
xpath_local_name(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    struct lyxp_set_node *item;

    /* suppress unused variable warning */
    (void)options;

    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);
        return LY_SUCCESS;
    }

    if (arg_count) {
        if (args[0]->type != LYXP_SET_NODE_SET) {
            LOGVAL(set->ctx, LY_VCODE_XP_INARGTYPE, 1, print_set_type(args[0]),
                    "local-name(node-set?)");
            return LY_EVALID;
        } else if (!args[0]->used) {
            set_fill_string(set, "", 0);
            return LY_SUCCESS;
        }

        /* we need the set sorted, it affects the result */
        assert(!set_sort(args[0]));

        item = &args[0]->val.nodes[0];
    } else {
        if (set->type != LYXP_SET_NODE_SET) {
            LOGVAL(set->ctx, LY_VCODE_XP_INCTX, print_set_type(set), "local-name(node-set?)");
            return LY_EVALID;
        } else if (!set->used) {
            set_fill_string(set, "", 0);
            return LY_SUCCESS;
        }

        /* we need the set sorted, it affects the result */
        assert(!set_sort(set));

        item = &set->val.nodes[0];
    }

    switch (item->type) {
    case LYXP_NODE_NONE:
        LOGINT_RET(set->ctx);
    case LYXP_NODE_ROOT:
    case LYXP_NODE_ROOT_CONFIG:
    case LYXP_NODE_TEXT:
        set_fill_string(set, "", 0);
        break;
    case LYXP_NODE_ELEM:
        set_fill_string(set, LYD_NAME(item->node), strlen(LYD_NAME(item->node)));
        break;
    case LYXP_NODE_META:
        set_fill_string(set, ((struct lyd_meta *)item->node)->name, strlen(((struct lyd_meta *)item->node)->name));
        break;
    }

    return LY_SUCCESS;
}